

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlCharEncOutFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int toconv;
  int len;
  xmlChar charref [20];
  char buf [50];
  int local_94;
  uint local_90;
  uint local_8c;
  uchar local_88 [32];
  char local_68 [49];
  undefined1 local_37;
  
  iVar2 = -1;
  if (out != (xmlBufferPtr)0x0 && handler != (xmlCharEncodingHandler *)0x0) {
    iVar5 = 0;
    do {
      while( true ) {
        uVar4 = (ulong)out->use;
        local_94 = out->size - out->use;
        local_94 = local_94 - (uint)(0 < local_94);
        if (in == (xmlBufferPtr)0x0) {
          local_90 = 0;
          xmlEncOutputChunk(handler,out->content + uVar4,&local_94,(uchar *)0x0,(int *)&local_90);
          uVar3 = out->use + local_94;
          out->use = uVar3;
          out->content[uVar3] = '\0';
          return 0;
        }
        local_90 = in->use;
        if (local_90 == 0) {
          return 0;
        }
        if (local_94 <= (int)(local_90 * 4)) {
          xmlBufferGrow(out,local_90 * 4);
          uVar4 = (ulong)out->use;
          local_94 = ~out->use + out->size;
        }
        iVar2 = xmlEncOutputChunk(handler,out->content + uVar4,&local_94,in->content,
                                  (int *)&local_90);
        xmlBufferShrink(in,local_90);
        uVar3 = out->use + local_94;
        out->use = uVar3;
        iVar5 = iVar5 + local_94;
        out->content[uVar3] = '\0';
        if (iVar2 != -2) break;
        local_8c = in->use;
        uVar3 = xmlGetUTF8Char(in->content,(int *)&local_8c);
        if ((int)uVar3 < 1) {
          iVar2 = -2;
          goto LAB_00145c5c;
        }
        uVar3 = snprintf((char *)local_88,0x14,"&#%d;",(ulong)uVar3);
        xmlBufferShrink(in,local_8c);
        xmlBufferGrow(out,uVar3 * 4);
        local_94 = ~out->use + out->size;
        local_90 = uVar3;
        iVar2 = xmlEncOutputChunk(handler,out->content + out->use,&local_94,local_88,
                                  (int *)&local_90);
        if ((iVar2 < 0) || (local_90 != uVar3)) {
          pbVar1 = in->content;
          snprintf(local_68,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*pbVar1,(ulong)pbVar1[1],
                   (ulong)pbVar1[2],(uint)pbVar1[3]);
          local_37 = 0;
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                          (void *)0x0,(void *)0x0,0x1b,0x1773,XML_ERR_FATAL,(char *)0x0,0,local_68,
                          (char *)0x0,(char *)0x0,0,0,
                          "output conversion failed due to conv error, bytes %s\n",local_68);
          if (in->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
            *in->content = ' ';
          }
          goto LAB_00145c5c;
        }
        uVar3 = out->use + local_94;
        out->use = uVar3;
        iVar5 = iVar5 + local_94;
        out->content[uVar3] = '\0';
      }
      if (iVar2 != -1) {
        if (iVar2 == -4) {
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                          (void *)0x0,(void *)0x0,0x1b,0x1774,XML_ERR_FATAL,(char *)0x0,0,
                          (char *)0x0,(char *)0x0,(char *)0x0,0,0,
                          "xmlCharEncOutFunc: no output function !\n",0);
          iVar2 = -1;
        }
        goto LAB_00145c5c;
      }
    } while (0 < local_94);
    iVar2 = -3;
LAB_00145c5c:
    if (iVar5 != 0) {
      iVar2 = iVar5;
    }
  }
  return iVar2;
}

Assistant:

int
xmlCharEncOutFunc(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                  xmlBufferPtr in) {
    int ret;
    int written;
    int writtentot = 0;
    int toconv;
    int output = 0;

    if (handler == NULL) return(-1);
    if (out == NULL) return(-1);

retry:

    written = out->size - out->use;

    if (written > 0)
	written--; /* Gennady: count '/0' */

    /*
     * First specific handling of in = NULL, i.e. the initialization call
     */
    if (in == NULL) {
        toconv = 0;
        /* TODO: Check return value. */
        xmlEncOutputChunk(handler, &out->content[out->use], &written,
                          NULL, &toconv);
        out->use += written;
        out->content[out->use] = 0;
#ifdef DEBUG_ENCODING
	xmlGenericError(xmlGenericErrorContext,
		"initialized encoder\n");
#endif
        return(0);
    }

    /*
     * Conversion itself.
     */
    toconv = in->use;
    if (toconv == 0)
	return(0);
    if (toconv * 4 >= written) {
        xmlBufferGrow(out, toconv * 4);
	written = out->size - out->use - 1;
    }
    ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                            in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    writtentot += written;
    out->content[out->use] = 0;
    if (ret == -1) {
        if (written > 0) {
            /* Can be a limitation of iconv or uconv */
            goto retry;
        }
        ret = -3;
    }

    if (ret >= 0) output += ret;

    /*
     * Attempt to handle error cases
     */
    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "converted %d bytes to %d bytes of output\n",
	            toconv, written);
#endif
	    break;
        case -1:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "output conversion failed by lack of space\n");
#endif
	    break;
        case -3:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of output %d left\n",
	            toconv, written, in->use);
#endif
	    break;
        case -4:
	    xmlEncodingErr(XML_I18N_NO_OUTPUT,
		           "xmlCharEncOutFunc: no output function !\n", NULL);
	    ret = -1;
            break;
        case -2: {
	    xmlChar charref[20];
	    int len = in->use;
	    const xmlChar *utf = (const xmlChar *) in->content;
	    int cur, charrefLen;

	    cur = xmlGetUTF8Char(utf, &len);
	    if (cur <= 0)
                break;

#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                    "handling output conversion error\n");
            xmlGenericError(xmlGenericErrorContext,
                    "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
                    in->content[0], in->content[1],
                    in->content[2], in->content[3]);
#endif
            /*
             * Removes the UTF8 sequence, and replace it by a charref
             * and continue the transcoding phase, hoping the error
             * did not mangle the encoder state.
             */
            charrefLen = snprintf((char *) &charref[0], sizeof(charref),
                             "&#%d;", cur);
            xmlBufferShrink(in, len);
            xmlBufferGrow(out, charrefLen * 4);
	    written = out->size - out->use - 1;
            toconv = charrefLen;
            ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                                    charref, &toconv);

	    if ((ret < 0) || (toconv != charrefLen)) {
		char buf[50];

		snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
			 in->content[0], in->content[1],
			 in->content[2], in->content[3]);
		buf[49] = 0;
		xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "output conversion failed due to conv error, bytes %s\n",
			       buf);
		if (in->alloc != XML_BUFFER_ALLOC_IMMUTABLE)
		    in->content[0] = ' ';
	        break;
	    }

            out->use += written;
            writtentot += written;
            out->content[out->use] = 0;
            goto retry;
	}
    }
    return(writtentot ? writtentot : ret);
}